

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  Impl *pIVar1;
  long *plVar2;
  CapTableBuilder *pCVar3;
  WirePointer *pWVar4;
  undefined8 uVar5;
  Server *pSVar6;
  RequestHook *pRVar7;
  ClientHook *pCVar8;
  uint *puVar9;
  uint *puVar10;
  uint defaultPort;
  undefined4 uVar11;
  int iVar12;
  undefined8 *puVar13;
  WaitScope *__stat_loc;
  char *__n;
  size_t sVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int __flags;
  Disposer *pDVar15;
  bool bVar16;
  Own<capnp::ClientHook> OVar17;
  Client CVar18;
  Reader RVar19;
  StringPtr bindAddress;
  StringPtr name;
  StringPtr name_00;
  StringPtr serverAddress;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  ReaderOptions readerOpts;
  ReaderOptions readerOpts_00;
  EzRpcServer server;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  EzRpcClient client;
  Client cap;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  EzRpcClient local_268;
  undefined1 local_258 [16];
  long *plStack_248;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_240;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_208;
  long *local_1d0;
  int local_1c4;
  EzRpcServer local_1c0;
  int local_1ac;
  Own<capnp::Capability::Server> local_1a8;
  uint *local_190;
  short local_184;
  undefined4 local_180;
  undefined8 *local_178;
  long *local_170;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_168;
  EzRpcClient local_130;
  Client local_120;
  Client local_110;
  undefined8 *local_100;
  long *plStack_f8;
  uint local_ec;
  undefined1 local_e8 [16];
  Server *pSStack_d8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_d0;
  Maybe<capnp::MessageSize> local_98;
  Maybe<capnp::MessageSize> local_80;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  bindAddress.content.size_ = 10;
  bindAddress.content.ptr = "localhost";
  readerOpts._8_8_ = 0x40;
  readerOpts.traversalLimitInWords = 0x800000;
  EzRpcServer::EzRpcServer(&local_1c0,bindAddress,0,readerOpts);
  local_1ac = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_208,&local_1ac);
  local_1a8.disposer = (Disposer *)local_208.super_Builder._builder.segment;
  local_1a8.ptr = (Server *)(local_208.super_Builder._builder.capTable + 2);
  if (local_208.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_1a8.ptr = (Server *)0x0;
  }
  local_208.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar17 = Capability::Client::makeLocalClient(&local_110,&local_1a8);
  pSVar6 = local_1a8.ptr;
  if (local_1a8.ptr != (Server *)0x0) {
    local_1a8.ptr = (Server *)0x0;
    (*(code *)((SegmentReader *)&(local_1a8.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_1a8.disposer,
               (_func_int *)
               ((long)&((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader +
               (long)((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader[-2]),OVar17.ptr
              );
  }
  name.content.size_ = 5;
  name.content.ptr = "cap1";
  EzRpcServer::exportCap(&local_1c0,name,&local_110);
  pCVar8 = local_110.hook.ptr;
  if (local_110.hook.ptr != (ClientHook *)0x0) {
    local_110.hook.ptr = (ClientHook *)0x0;
    (**(local_110.hook.disposer)->_vptr_Disposer)
              (local_110.hook.disposer,
               (_func_int *)((long)&pCVar8->_vptr_ClientHook + (long)pCVar8->_vptr_ClientHook[-2]));
  }
  pCVar3 = local_208.super_Builder._builder.capTable;
  if (local_208.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_208.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_208.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_208.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  puVar13 = (undefined8 *)operator_new(0x20);
  puVar13[2] = 0;
  puVar13[3] = 0;
  *puVar13 = 0;
  puVar13[1] = 0;
  local_1a8.ptr = (Server *)(puVar13 + 2);
  puVar13[3] = 0;
  *puVar13 = 0x6358c8;
  puVar13[2] = 0x6358f0;
  *(undefined4 *)(puVar13 + 1) = 0;
  local_1a8.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::TestCallOrderImpl>::instance;
  OVar17 = Capability::Client::makeLocalClient(&local_120,&local_1a8);
  pSVar6 = local_1a8.ptr;
  if (local_1a8.ptr != (Server *)0x0) {
    local_1a8.ptr = (Server *)0x0;
    (*(code *)((SegmentReader *)&(local_1a8.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_1a8.disposer,
               (_func_int *)
               ((long)&((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader +
               (long)((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader[-2]),OVar17.ptr
              );
  }
  name_00.content.size_ = 5;
  name_00.content.ptr = "cap2";
  EzRpcServer::exportCap(&local_1c0,name_00,&local_120);
  pCVar8 = local_120.hook.ptr;
  if (local_120.hook.ptr != (ClientHook *)0x0) {
    local_120.hook.ptr = (ClientHook *)0x0;
    (**(local_120.hook.disposer)->_vptr_Disposer)
              (local_120.hook.disposer,
               (_func_int *)((long)&pCVar8->_vptr_ClientHook + (long)pCVar8->_vptr_ClientHook[-2]));
  }
  EzRpcServer::getPort((EzRpcServer *)&local_1a8);
  __stat_loc = EzRpcServer::getWaitScope(&local_1c0);
  defaultPort = kj::Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_1a8,__stat_loc);
  serverAddress.content.size_ = 10;
  serverAddress.content.ptr = "localhost";
  readerOpts_00._8_8_ = 0x40;
  readerOpts_00.traversalLimitInWords = 0x800000;
  __flags = 0x800000;
  EzRpcClient::EzRpcClient(&local_130,serverAddress,defaultPort,readerOpts_00);
  pSVar6 = local_1a8.ptr;
  if (local_1a8.ptr != (Server *)0x0) {
    local_1a8.ptr = (Server *)0x0;
    (*(code *)((SegmentReader *)&(local_1a8.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_1a8.disposer,
               (_func_int *)
               ((long)&((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader +
               (long)((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader[-2]));
  }
  __n = (char *)0x5;
  name_01.content.size_ = (size_t)"cap1";
  name_01.content.ptr = (char *)&local_130;
  CVar18 = EzRpcClient::importCap((EzRpcClient *)&local_208,name_01);
  (*((local_208.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (&local_1a8,local_208.super_Builder._builder.capTable,CVar18.hook.ptr);
  pCVar3 = local_208.super_Builder._builder.capTable;
  local_e8._8_4_ = local_1a8.disposer._0_4_;
  local_e8._12_4_ = local_1a8.disposer._4_4_;
  pSStack_d8 = local_1a8.ptr;
  local_e8._0_8_ = &Capability::Client::typeinfo;
  if (local_208.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_208.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_208.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_208.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_d0,(Client *)local_e8,&local_38);
  *(undefined4 *)local_d0.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_d0.super_Builder._builder.data + 4) =
       *(byte *)((long)local_d0.super_Builder._builder.data + 4) | 1;
  __buf = extraout_RDX;
  if ((local_1ac != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.disposer = (Disposer *)((ulong)local_1a8.disposer & 0xffffffff00000000);
    __n = "\"failed: expected \" \"(0) == (callCount)\", 0, callCount";
    __flags = 0x4c95ab;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1a8,&local_1ac);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_208,(int)&local_d0,__buf,(size_t)__n,__flags);
  EzRpcServer::getWaitScope(&local_1c0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_1a8,&local_208);
  pDVar15 = local_208.hook.disposer;
  uVar5 = local_208.super_Builder._builder._32_8_;
  if (local_208.super_Builder._builder._32_8_ != 0) {
    local_208.super_Builder._builder.dataSize = 0;
    local_208.super_Builder._builder.pointerCount = 0;
    local_208.super_Builder._builder._38_2_ = 0;
    local_208.hook.disposer = (Disposer *)0x0;
    (**(local_208.hook.ptr)->_vptr_RequestHook)(local_208.hook.ptr,uVar5,8,pDVar15,pDVar15,0);
    __flags = (int)pDVar15;
  }
  pWVar4 = local_208.super_Builder._builder.pointers;
  if (local_208.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_208.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_208.super_Builder._builder.data)
              (local_208.super_Builder._builder.data,
               (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  if (local_208.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_208.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_208.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )();
  }
  local_208.super_Builder._builder.capTable = (CapTableBuilder *)local_1a8.ptr;
  local_208.super_Builder._builder.data = local_190;
  local_208.super_Builder._builder.segment = (SegmentBuilder *)local_1a8.disposer;
  uVar11 = local_180;
  if (local_184 == 0) {
    local_208.super_Builder._builder.capTable = (CapTableBuilder *)(Server *)0x0;
    local_208.super_Builder._builder.data = (uint *)0x0;
    local_208.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    uVar11 = 0x7fffffff;
  }
  local_208.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_208.super_Builder._builder.pointers._4_4_,uVar11);
  RVar19 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_208,(void *)0x0,0);
  puVar9 = (uint *)local_208.super_Builder._builder.data;
  puVar10 = local_190;
  if (((RVar19.super_StringPtr.content.size_ != 4) ||
      (iVar12 = bcmp(RVar19.super_StringPtr.content.ptr,"foo",3),
      puVar9 = (uint *)local_208.super_Builder._builder.data, puVar10 = local_190, iVar12 != 0)) &&
     (local_208.super_Builder._builder.data = puVar10, kj::_::Debug::minSeverity < 3)) {
    local_208.super_Builder._builder.capTable = (CapTableBuilder *)local_1a8.ptr;
    local_208.super_Builder._builder.segment = (SegmentBuilder *)local_1a8.disposer;
    if (local_184 == 0) {
      local_180 = 0x7fffffff;
      local_208.super_Builder._builder.data = (uint *)0x0;
      local_208.super_Builder._builder.capTable = (CapTableBuilder *)(Server *)0x0;
      local_208.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    }
    local_208.super_Builder._builder.pointers._4_4_ =
         (undefined4)((ulong)local_208.super_Builder._builder.pointers >> 0x20);
    local_208.super_Builder._builder.pointers =
         (WirePointer *)CONCAT44(local_208.super_Builder._builder.pointers._4_4_,local_180);
    local_240.super_Builder._builder._0_16_ =
         PointerReader::getBlob<capnp::Text>((PointerReader *)&local_208,(void *)0x0,0);
    __flags = 0x4cad93;
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x40,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (char (*) [4])0x4fa6a4,(Reader *)&local_240);
    puVar9 = (uint *)local_208.super_Builder._builder.data;
  }
  local_208.super_Builder._builder.data = puVar9;
  if ((local_1ac != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_208.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_208.super_Builder._builder.segment._4_4_,1);
    __flags = 0x4cc3e2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&local_208,&local_1ac);
  }
  sVar14 = 5;
  name_02.content.size_ = (size_t)"cap2";
  name_02.content.ptr = (char *)&local_130;
  CVar18 = EzRpcClient::importCap(&local_268,name_02);
  (*(code *)((local_268.impl.ptr)->context).disposer[4]._vptr_Disposer)
            (&local_100,local_268.impl.ptr,CVar18.hook.ptr);
  local_258._8_8_ = local_100;
  plStack_248 = plStack_f8;
  local_258._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_168,(Client *)local_258,&local_50);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_240,(int)&local_168,__buf_00,sVar14,__flags);
  EzRpcServer::getWaitScope(&local_1c0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_208,(ArrayPtr<const_char> *)&local_240);
  plVar2 = local_1d0;
  if (local_208.super_Builder._builder.dataSize < 0x20) {
    bVar16 = false;
  }
  else {
    bVar16 = *local_208.super_Builder._builder.data != 0;
  }
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(local_208.hook.ptr)->_vptr_RequestHook)
              (local_208.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pDVar15 = local_240.hook.disposer;
  uVar5 = local_240.super_Builder._builder._32_8_;
  if (local_240.super_Builder._builder._32_8_ != 0) {
    local_240.super_Builder._builder.dataSize = 0;
    local_240.super_Builder._builder.pointerCount = 0;
    local_240.super_Builder._builder._38_2_ = 0;
    local_240.hook.disposer = (Disposer *)0x0;
    (**(local_240.hook.ptr)->_vptr_RequestHook)(local_240.hook.ptr,uVar5,8,pDVar15,pDVar15,0);
    __flags = (int)pDVar15;
  }
  pWVar4 = local_240.super_Builder._builder.pointers;
  if (local_240.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_240.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_240.super_Builder._builder.data)
              (local_240.super_Builder._builder.data,
               (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  pCVar3 = local_240.super_Builder._builder.capTable;
  if (local_240.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_240.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_240.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_240.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_168.hook.ptr;
  if (local_168.hook.ptr != (RequestHook *)0x0) {
    local_168.hook.ptr = (RequestHook *)0x0;
    (**(local_168.hook.disposer)->_vptr_Disposer)
              (local_168.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  plVar2 = plStack_248;
  if (plStack_248 != (long *)0x0) {
    plStack_248 = (long *)0x0;
    (*(code *)**(undefined8 **)local_258._8_8_)
              (local_258._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pIVar1 = local_268.impl.ptr;
  if (local_268.impl.ptr != (Impl *)0x0) {
    local_268.impl.ptr = (Impl *)0x0;
    (**(local_268.impl.disposer)->_vptr_Disposer)
              (local_268.impl.disposer,
               (long)&(pIVar1->context).disposer +
               (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
  }
  if ((bool)(bVar16 & kj::_::Debug::minSeverity < 3)) {
    local_1c4 = 0;
    sVar14 = 5;
    name_03.content.size_ = (size_t)"cap2";
    name_03.content.ptr = (char *)&local_130;
    CVar18 = EzRpcClient::importCap(&local_268,name_03);
    (*(code *)((local_268.impl.ptr)->context).disposer[4]._vptr_Disposer)
              (&local_100,local_268.impl.ptr,CVar18.hook.ptr);
    local_258._8_8_ = local_100;
    plStack_248 = plStack_f8;
    local_258._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    local_68.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_168,(Client *)local_258,&local_68);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send(&local_240,(int)&local_168,__buf_01,sVar14,__flags);
    EzRpcServer::getWaitScope(&local_1c0);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_208,(ArrayPtr<const_char> *)&local_240);
    local_ec = 0;
    if (0x1f < local_208.super_Builder._builder.dataSize) {
      local_ec = *local_208.super_Builder._builder.data;
    }
    __flags = 0x4ff7dc;
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x44,ERROR,
               "\"failed: expected \" \"(0) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 0, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (0) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_1c4,&local_ec);
    plVar2 = local_1d0;
    if (local_1d0 != (long *)0x0) {
      local_1d0 = (long *)0x0;
      (**(local_208.hook.ptr)->_vptr_RequestHook)
                (local_208.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pDVar15 = local_240.hook.disposer;
    uVar5 = local_240.super_Builder._builder._32_8_;
    if (local_240.super_Builder._builder._32_8_ != 0) {
      local_240.super_Builder._builder.dataSize = 0;
      local_240.super_Builder._builder.pointerCount = 0;
      local_240.super_Builder._builder._38_2_ = 0;
      local_240.hook.disposer = (Disposer *)0x0;
      (**(local_240.hook.ptr)->_vptr_RequestHook)(local_240.hook.ptr,uVar5,8,pDVar15,pDVar15,0);
      __flags = (int)pDVar15;
    }
    pWVar4 = local_240.super_Builder._builder.pointers;
    if (local_240.super_Builder._builder.pointers != (WirePointer *)0x0) {
      local_240.super_Builder._builder.pointers = (WirePointer *)0x0;
      (*(code *)**local_240.super_Builder._builder.data)
                (local_240.super_Builder._builder.data,
                 (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
    }
    pCVar3 = local_240.super_Builder._builder.capTable;
    if (local_240.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
      local_240.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_240.super_Builder._builder.segment)->super_SegmentReader).arena)->
                _vptr_Arena)
                (local_240.super_Builder._builder.segment,
                 (_func_int *)
                 ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
                 (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
    }
    pRVar7 = local_168.hook.ptr;
    if (local_168.hook.ptr != (RequestHook *)0x0) {
      local_168.hook.ptr = (RequestHook *)0x0;
      (**(local_168.hook.disposer)->_vptr_Disposer)
                (local_168.hook.disposer,
                 (_func_int *)
                 ((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2]));
    }
    plVar2 = plStack_248;
    if (plStack_248 != (long *)0x0) {
      plStack_248 = (long *)0x0;
      (*(code *)**(undefined8 **)local_258._8_8_)
                (local_258._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pIVar1 = local_268.impl.ptr;
    if (local_268.impl.ptr != (Impl *)0x0) {
      local_268.impl.ptr = (Impl *)0x0;
      (**(local_268.impl.disposer)->_vptr_Disposer)
                (local_268.impl.disposer,
                 (long)&(pIVar1->context).disposer +
                 (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
    }
  }
  sVar14 = 5;
  name_04.content.size_ = (size_t)"cap2";
  name_04.content.ptr = (char *)&local_130;
  CVar18 = EzRpcClient::importCap(&local_268,name_04);
  (*(code *)((local_268.impl.ptr)->context).disposer[4]._vptr_Disposer)
            (&local_100,local_268.impl.ptr,CVar18.hook.ptr);
  local_258._8_8_ = local_100;
  plStack_248 = plStack_f8;
  local_258._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_80.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_168,(Client *)local_258,&local_80);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_240,(int)&local_168,__buf_02,sVar14,__flags);
  EzRpcServer::getWaitScope(&local_1c0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_208,(ArrayPtr<const_char> *)&local_240);
  plVar2 = local_1d0;
  bVar16 = true;
  if (0x1f < local_208.super_Builder._builder.dataSize) {
    bVar16 = *local_208.super_Builder._builder.data != 1;
  }
  if (local_1d0 != (long *)0x0) {
    local_1d0 = (long *)0x0;
    (**(local_208.hook.ptr)->_vptr_RequestHook)
              (local_208.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pDVar15 = local_240.hook.disposer;
  uVar5 = local_240.super_Builder._builder._32_8_;
  if (local_240.super_Builder._builder._32_8_ != 0) {
    local_240.super_Builder._builder.dataSize = 0;
    local_240.super_Builder._builder.pointerCount = 0;
    local_240.super_Builder._builder._38_2_ = 0;
    local_240.hook.disposer = (Disposer *)0x0;
    (**(local_240.hook.ptr)->_vptr_RequestHook)(local_240.hook.ptr,uVar5,8,pDVar15,pDVar15,0);
    __flags = (int)pDVar15;
  }
  pWVar4 = local_240.super_Builder._builder.pointers;
  if (local_240.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_240.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_240.super_Builder._builder.data)
              (local_240.super_Builder._builder.data,
               (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
  }
  pCVar3 = local_240.super_Builder._builder.capTable;
  if (local_240.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_240.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_240.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_240.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar7 = local_168.hook.ptr;
  if (local_168.hook.ptr != (RequestHook *)0x0) {
    local_168.hook.ptr = (RequestHook *)0x0;
    (**(local_168.hook.disposer)->_vptr_Disposer)
              (local_168.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  plVar2 = plStack_248;
  if (plStack_248 != (long *)0x0) {
    plStack_248 = (long *)0x0;
    (*(code *)**(undefined8 **)local_258._8_8_)
              (local_258._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pIVar1 = local_268.impl.ptr;
  if (local_268.impl.ptr != (Impl *)0x0) {
    local_268.impl.ptr = (Impl *)0x0;
    (**(local_268.impl.disposer)->_vptr_Disposer)
              (local_268.impl.disposer,
               (long)&(pIVar1->context).disposer +
               (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
  }
  if ((bool)(bVar16 & kj::_::Debug::minSeverity < 3)) {
    local_1c4 = 1;
    sVar14 = 5;
    name_05.content.size_ = (size_t)"cap2";
    name_05.content.ptr = (char *)&local_130;
    CVar18 = EzRpcClient::importCap(&local_268,name_05);
    (*(code *)((local_268.impl.ptr)->context).disposer[4]._vptr_Disposer)
              (&local_100,local_268.impl.ptr,CVar18.hook.ptr);
    local_258._8_8_ = local_100;
    plStack_248 = plStack_f8;
    local_258._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    local_98.ptr.isSet = false;
    capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
              (&local_168,(Client *)local_258,&local_98);
    Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
    ::send(&local_240,(int)&local_168,__buf_03,sVar14,__flags);
    EzRpcServer::getWaitScope(&local_1c0);
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_208,(ArrayPtr<const_char> *)&local_240);
    local_ec = 0;
    if (0x1f < local_208.super_Builder._builder.dataSize) {
      local_ec = *local_208.super_Builder._builder.data;
    }
    kj::_::Debug::log<char_const(&)[149],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(1) == (client.importCap(\\\"cap2\\\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())\", 1, client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN()"
               ,(char (*) [149])
                "failed: expected (1) == (client.importCap(\"cap2\").castAs<test::TestCallOrder>() .getCallSequenceRequest().send().wait(server.getWaitScope()).getN())"
               ,&local_1c4,&local_ec);
    plVar2 = local_1d0;
    if (local_1d0 != (long *)0x0) {
      local_1d0 = (long *)0x0;
      (**(local_208.hook.ptr)->_vptr_RequestHook)
                (local_208.hook.ptr,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pDVar15 = local_240.hook.disposer;
    uVar5 = local_240.super_Builder._builder._32_8_;
    if (local_240.super_Builder._builder._32_8_ != 0) {
      local_240.super_Builder._builder.dataSize = 0;
      local_240.super_Builder._builder.pointerCount = 0;
      local_240.super_Builder._builder._38_2_ = 0;
      local_240.hook.disposer = (Disposer *)0x0;
      (**(local_240.hook.ptr)->_vptr_RequestHook)(local_240.hook.ptr,uVar5,8,pDVar15,pDVar15,0);
    }
    pWVar4 = local_240.super_Builder._builder.pointers;
    if (local_240.super_Builder._builder.pointers != (WirePointer *)0x0) {
      local_240.super_Builder._builder.pointers = (WirePointer *)0x0;
      (*(code *)**local_240.super_Builder._builder.data)
                (local_240.super_Builder._builder.data,
                 (long)&(pWVar4->offsetAndKind).value + *(long *)((long)*pWVar4 + -0x10));
    }
    pCVar3 = local_240.super_Builder._builder.capTable;
    if (local_240.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
      local_240.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_240.super_Builder._builder.segment)->super_SegmentReader).arena)->
                _vptr_Arena)
                (local_240.super_Builder._builder.segment,
                 (_func_int *)
                 ((long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader +
                 (long)(pCVar3->super_CapTableReader)._vptr_CapTableReader[-2]));
    }
    pRVar7 = local_168.hook.ptr;
    if (local_168.hook.ptr != (RequestHook *)0x0) {
      local_168.hook.ptr = (RequestHook *)0x0;
      (**(local_168.hook.disposer)->_vptr_Disposer)
                (local_168.hook.disposer,
                 (_func_int *)
                 ((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2]));
    }
    plVar2 = plStack_248;
    if (plStack_248 != (long *)0x0) {
      plStack_248 = (long *)0x0;
      (*(code *)**(undefined8 **)local_258._8_8_)
                (local_258._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    pIVar1 = local_268.impl.ptr;
    if (local_268.impl.ptr != (Impl *)0x0) {
      local_268.impl.ptr = (Impl *)0x0;
      (**(local_268.impl.disposer)->_vptr_Disposer)
                (local_268.impl.disposer,
                 (long)&(pIVar1->context).disposer +
                 (long)(pIVar1->context).disposer[-2]._vptr_Disposer);
    }
  }
  plVar2 = local_170;
  if (local_170 != (long *)0x0) {
    local_170 = (long *)0x0;
    (**(code **)*local_178)(local_178,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  pRVar7 = local_d0.hook.ptr;
  if (local_d0.hook.ptr != (RequestHook *)0x0) {
    local_d0.hook.ptr = (RequestHook *)0x0;
    (**(local_d0.hook.disposer)->_vptr_Disposer)
              (local_d0.hook.disposer,
               (_func_int *)((long)&pRVar7->_vptr_RequestHook + (long)pRVar7->_vptr_RequestHook[-2])
              );
  }
  pSVar6 = pSStack_d8;
  if (pSStack_d8 != (Server *)0x0) {
    pSStack_d8 = (Server *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_e8._12_4_,local_e8._8_4_))
              ((undefined8 *)CONCAT44(local_e8._12_4_,local_e8._8_4_),
               (_func_int *)
               ((long)&((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader +
               (long)((CapTableReader *)&pSVar6->_vptr_Server)->_vptr_CapTableReader[-2]));
  }
  EzRpcClient::~EzRpcClient(&local_130);
  EzRpcServer::~EzRpcServer(&local_1c0);
  return;
}

Assistant:

TEST(EzRpc, DeprecatedNames) {
  EzRpcServer server("localhost");
  int callCount = 0;
  server.exportCap("cap1", kj::heap<TestInterfaceImpl>(callCount));
  server.exportCap("cap2", kj::heap<TestCallOrderImpl>());

  EzRpcClient client("localhost", server.getPort().wait(server.getWaitScope()));

  auto cap = client.importCap<test::TestInterface>("cap1");
  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(server.getWaitScope());
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);

  EXPECT_EQ(0, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
  EXPECT_EQ(1, client.importCap("cap2").castAs<test::TestCallOrder>()
      .getCallSequenceRequest().send().wait(server.getWaitScope()).getN());
}